

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O1

bool __thiscall LTFlightData::AircraftMaintenance(LTFlightData *this,double simTime)

{
  ulong uVar1;
  LTAircraft *pLVar2;
  _Map_pointer pppVar3;
  bool bVar4;
  int iVar5;
  _Elt_pointer ppVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  unique_lock<std::recursive_mutex> lock;
  unique_lock<std::recursive_mutex> local_40;
  
  local_40._M_device = &this->dataAccessMutex;
  iVar5 = pthread_mutex_trylock((pthread_mutex_t *)local_40._M_device);
  local_40._M_owns = iVar5 == 0;
  if (local_40._M_owns) {
    if (dataRefs.labelCfg != this->labelCfg) {
      UpdateStaticLabel(this);
    }
    if (dataRefs.bReInitAll == false) {
      pLVar2 = this->pAc;
      if (pLVar2 == (LTAircraft *)0x0) {
        while( true ) {
          pppVar3 = (this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_node;
          ppVar6 = (this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar10 = ((long)(this->posDeque).
                          super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
                          super__Deque_impl_data._M_start._M_last - (long)ppVar6 >> 3) *
                   -0x71c71c71c71c71c7 +
                   ((long)(this->posDeque).
                          super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_cur -
                    (long)(this->posDeque).
                          super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_first >> 3) * -0x71c71c71c71c71c7 +
                   (((long)pppVar3 -
                     (long)(this->posDeque).
                           super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
                           super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                   (ulong)(pppVar3 == (_Map_pointer)0x0)) * 7;
          if (uVar10 < 2) break;
          lVar8 = (long)ppVar6 -
                  (long)(this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_first;
          lVar7 = lVar8 >> 3;
          uVar1 = lVar7 * -0x71c71c71c71c71c7 + 1;
          if (uVar1 < 7) {
            ppVar6 = ppVar6 + 1;
          }
          else {
            if (lVar8 < -0x47) {
              uVar9 = ~((lVar7 * 0x71c71c71c71c71c7 - 2U) / 7);
            }
            else {
              uVar9 = uVar1 / 7;
            }
            ppVar6 = (this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>.
                     _M_impl.super__Deque_impl_data._M_start._M_node[uVar9] + uVar9 * -7 + uVar1;
          }
          if (simTime < ppVar6->_ts || simTime == ppVar6->_ts) {
            if (1 < uVar10) {
              bVar4 = validForAcCreate(this,simTime);
              if (bVar4) {
                CreateAircraft(this,simTime);
              }
              else if (((this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_cur)->_ts <= simTime) {
                TriggerCalcNewPos(this,NAN);
              }
            }
            break;
          }
          std::deque<positionTy,_std::allocator<positionTy>_>::pop_front(&this->posDeque);
        }
      }
      else if (((pLVar2->super_Aircraft).bValid != true) ||
              ((double)(dataRefs.fdStdDistance * 0x73c) < (pLVar2->vecView).dist)) {
        DestroyAircraft(this);
      }
      else if (((0x45 < pLVar2->phase) ||
               ((0x3b < pLVar2->phase && (bVar4 = positionTy::isNormal(&this->posRwy,false), bVar4))
               )) && (this->pAc->phase < FPH_STOPPED_ON_RWY)) goto LAB_001756b5;
      if ((double)(~-(ulong)NAN(simTime) & (ulong)simTime |
                  (ulong)dataRefs.lastSimTime & -(ulong)NAN(simTime)) <=
          (double)(dataRefs.fdBufPeriod * 2) + this->youngestTS) goto LAB_001756b5;
    }
    bVar4 = true;
    SetInvalid(this,false);
  }
  else {
LAB_001756b5:
    bVar4 = false;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_40);
  return bVar4;
}

Assistant:

bool LTFlightData::AircraftMaintenance ( double simTime )
{
    try {
        // try to lock data access
        std::unique_lock<std::recursive_mutex> lock (dataAccessMutex, std::try_to_lock);
        if ( !lock )                // we didn't get the lock, just return w/o deletion
            return false;
        
        // do we need to recalc the static part of the a/c label due to config change?
        if (dataRefs.GetLabelCfg() != labelCfg)
            UpdateStaticLabel();
        
        // general re-init necessary?
        if (dataRefs.IsReInitAll()) {
            SetInvalid(false);
            return true;
        }

        // Tests on an existing aircraft object
        if (hasAc())
        {
            // if the a/c became invalid or has flown out of sight
            // then remove the aircraft object,
            // but retain the remaining flight data
            if (!pAc->IsValid() ||
                pAc->GetVecView().dist > dataRefs.GetFdStdDistance_m())
                DestroyAircraft();
            else {
                // cover the special case of finishing landing and roll-out without live positions
                // i.e. during approach and landing we don't destroy the aircraft
                //      if it is approaching some runway
                //      until it finally stopped on the runway
                if ((pAc->GetFlightPhase() >= FPH_LANDING ||
                        (pAc->GetFlightPhase() >= FPH_APPROACH && posRwy.isNormal())) &&
                    pAc->GetFlightPhase() < FPH_STOPPED_ON_RWY)
                {
                    return false;
                }
            }
        }
        // Tests when not (yet) having an aircraft object
        else {
            // Remove position from the beginning for as long as there is past data,
            // i.e.: Only the .front pos may be in the past
            while (posDeque.size() >= 2 && posDeque[1].ts() < simTime)
                posDeque.pop_front();

            // Have at least two positions?
            if (posDeque.size() >= 2 ) {
                // is already valid for a/c creation?
                if ( validForAcCreate(simTime) )
                    // then do create the aircraft
                    CreateAircraft(simTime);
                else // not yet valid
                    // but the oldest position is at or before current simTime?
                    // then chances are good that we can calculate positions
                    if ( posDeque.front().ts() <= simTime)
                        // start thread for position calculation...next time we might be valid for creation
                        TriggerCalcNewPos(NAN);
            }
        }
            
        // youngestTS longer ago than allowed? -> remove the entire FD object
        if (youngestTS + dataRefs.GetAcOutdatedIntvl() <
            (std::isnan(simTime) ? dataRefs.GetSimTime() : simTime))
        {
            SetInvalid(false);
            return true;
        }

        // don't delete me
        return false;
        
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, key().c_str(), e.what());
    } catch(...) {
    }
    
    // in case of error return 'delete me'
    SetInvalid();
    return true;
}